

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void acquireMonitor(_GLFWwindow *window)

{
  long in_RDI;
  wl_output *in_stack_00000008;
  xdg_toplevel *in_stack_00000010;
  
  if (*(long *)(in_RDI + 0x3d8) == 0) {
    if (*(long *)(in_RDI + 0x3c0) != 0) {
      xdg_toplevel_set_fullscreen(in_stack_00000010,in_stack_00000008);
    }
  }
  else {
    (*_glfw.wl.libdecor.libdecor_frame_set_fullscreen_)
              (*(libdecor_frame **)(in_RDI + 0x3d8),
               *(wl_output **)(*(long *)(in_RDI + 0x50) + 0x100));
  }
  setIdleInhibitor(window,(GLFWbool)((ulong)in_RDI >> 0x20));
  if (*(int *)(in_RDI + 0x460) != 0) {
    destroyFallbackDecorations((_GLFWwindow *)0x9e1502);
  }
  return;
}

Assistant:

static void acquireMonitor(_GLFWwindow* window)
{
    if (_glfw.x11.saver.count == 0)
    {
        // Remember old screen saver settings
        XGetScreenSaver(_glfw.x11.display,
                        &_glfw.x11.saver.timeout,
                        &_glfw.x11.saver.interval,
                        &_glfw.x11.saver.blanking,
                        &_glfw.x11.saver.exposure);

        // Disable screen saver
        XSetScreenSaver(_glfw.x11.display, 0, 0, DontPreferBlanking,
                        DefaultExposures);
    }

    if (!window->monitor->window)
        _glfw.x11.saver.count++;

    _glfwSetVideoModeX11(window->monitor, &window->videoMode);

    if (window->x11.overrideRedirect)
    {
        int xpos, ypos;
        GLFWvidmode mode;

        // Manually position the window over its monitor
        _glfwGetMonitorPosX11(window->monitor, &xpos, &ypos);
        _glfwGetVideoModeX11(window->monitor, &mode);

        XMoveResizeWindow(_glfw.x11.display, window->x11.handle,
                          xpos, ypos, mode.width, mode.height);
    }

    _glfwInputMonitorWindow(window->monitor, window);
}